

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  string *psVar1;
  string *psVar2;
  pointer pcVar3;
  cmCTest *pcVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  _func_int **pp_Var13;
  char *pcVar14;
  char *pcVar15;
  pointer pbVar16;
  pointer pcVar17;
  char *pcVar18;
  long lVar19;
  double dVar20;
  int retVal;
  cmXMLWriter xml;
  string srcdirrep;
  cmGeneratedFileStream xofs;
  string makeCommand;
  cmGeneratedFileStream ofs;
  int local_6fc;
  undefined1 local_6f8 [48];
  long *local_6c8;
  long local_6b8 [2];
  undefined1 local_6a8 [112];
  ios_base local_638 [264];
  undefined1 local_530 [8];
  undefined1 local_528 [104];
  ios_base local_4c0 [72];
  char *local_478;
  char *local_470;
  double local_2e8;
  double local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Build project",0xd);
  std::ios::widen((char)(ostringstream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_278);
  std::ostream::flush();
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x13c,(char *)local_530,(this->super_cmCTestGenericHandler).Quiet);
  if (local_530 != (undefined1  [8])(local_528 + 8)) {
    operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  dVar20 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar9 = 0;
  if (120.0 <= dVar20) {
    pcVar14 = "^Warning W[0-9]+ ([a-zA-Z.\\:/0-9_+ ~-]+) ([0-9]+):";
    lVar19 = 0x10;
    do {
      local_470 = (char *)0x0;
      bVar7 = cmsys::RegularExpression::compile((RegularExpression *)local_528,pcVar14);
      if (bVar7) {
        local_530 = *(undefined1 (*) [8])((long)&PTR_Initialize_006cc058 + lVar19);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)local_530);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Problem Compiling regular expression: ",0x26);
        sVar10 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar14,sVar10);
        cVar5 = (char)(ostringstream *)local_278;
        std::ios::widen((char)*(undefined8 *)(local_278._0_8_ + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x156,(char *)local_6a8._0_8_,false);
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
      }
      if (local_470 != (char *)0x0) {
        operator_delete__(local_470);
      }
      pcVar14 = *(char **)((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar19);
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x80);
    GetMakeCommand_abi_cxx11_(&local_2d8,this);
    if (local_2d8._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Cannot find MakeCommand key in the DartConfiguration.tcl",
                 0x38);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x160,(char *)local_530,false);
      if (local_530 != (undefined1  [8])(local_528 + 8)) {
        operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
      iVar9 = -1;
    }
    else {
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      pcVar3 = local_278 + 0x10;
      local_278._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_2b8,pcVar4,(string *)local_278);
      if ((pointer)local_278._0_8_ != pcVar3) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if (local_2b8._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,
                   "Cannot find BuildDirectory  key in the DartConfiguration.tcl",0x3c);
        std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_278);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x16a,(char *)local_530,false);
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        iVar9 = -1;
      }
      else {
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_278._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"UseLaunchers","");
        cmCTest::GetCTestConfiguration(&local_298,pcVar4,(string *)local_278);
        if ((pointer)local_278._0_8_ != pcVar3) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        bVar7 = cmSystemTools::IsOn(local_298._M_dataplus._M_p);
        this->UseCTestLaunch = bVar7;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        local_2e0 = cmsys::SystemTools::GetTime();
        bVar7 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)local_278);
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_530,"Cannot create build log file",0x1c);
          std::ios::widen((char)(ostream *)local_530 +
                          (char)*(_func_int **)((long)local_530 + -0x18));
          std::ostream::put((char)local_530);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x178,(char *)local_6a8._0_8_,false);
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
          std::ios_base::~ios_base(local_4c0);
        }
        lVar19 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_530,*(char **)((long)cmCTestErrorMatches + lVar19),
                     (allocator *)local_6a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
          ;
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
          lVar19 = lVar19 + 8;
        } while (lVar19 != 0x1b8);
        lVar19 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_530,*(char **)((long)cmCTestErrorExceptions + lVar19),
                     (allocator *)local_6a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
          ;
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
          lVar19 = lVar19 + 8;
        } while (lVar19 != 0x50);
        lVar19 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_530,*(char **)((long)cmCTestWarningMatches + lVar19),
                     (allocator *)local_6a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
          ;
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
          lVar19 = lVar19 + 8;
        } while (lVar19 != 0xa8);
        lVar19 = 0;
        do {
          std::__cxx11::string::string
                    ((string *)local_530,*(char **)((long)cmCTestWarningExceptions + lVar19),
                     (allocator *)local_6a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
          ;
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
          lVar19 = lVar19 + 8;
        } while (lVar19 != 0x80);
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
        poVar11 = std::ostream::_M_insert<void_const*>(local_530);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Add this->ErrorMatchRegex",0x19)
        ;
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x19e,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
        std::ios_base::~ios_base(local_4c0);
        pbVar16 = (this->CustomErrorMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar16 !=
            (this->CustomErrorMatches).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_530,"Add this->CustomErrorMatches: ",0x1e);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_530,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x19e,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
              operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
            std::ios_base::~ios_base(local_4c0);
            pcVar14 = (pbVar16->_M_dataplus)._M_p;
            local_478 = (char *)0x0;
            if (pcVar14 != (char *)0x0) {
              cmsys::RegularExpression::compile((RegularExpression *)local_530,pcVar14);
            }
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
            emplace_back<cmsys::RegularExpression>
                      (&this->ErrorMatchRegex,(RegularExpression *)local_530);
            if (local_478 != (char *)0x0) {
              operator_delete__(local_478);
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 !=
                   (this->CustomErrorMatches).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
        poVar11 = std::ostream::_M_insert<void_const*>(local_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"Add this->ErrorExceptionRegex",0x1d);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a0,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
        std::ios_base::~ios_base(local_4c0);
        pbVar16 = (this->CustomErrorExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar16 !=
            (this->CustomErrorExceptions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_530,"Add this->CustomErrorExceptions: ",0x21);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_530,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1a0,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
              operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
            std::ios_base::~ios_base(local_4c0);
            pcVar14 = (pbVar16->_M_dataplus)._M_p;
            local_478 = (char *)0x0;
            if (pcVar14 != (char *)0x0) {
              cmsys::RegularExpression::compile((RegularExpression *)local_530,pcVar14);
            }
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
            emplace_back<cmsys::RegularExpression>
                      (&this->ErrorExceptionRegex,(RegularExpression *)local_530);
            if (local_478 != (char *)0x0) {
              operator_delete__(local_478);
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 !=
                   (this->CustomErrorExceptions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
        poVar11 = std::ostream::_M_insert<void_const*>(local_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"Add this->WarningMatchRegex",0x1b);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a2,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
        std::ios_base::~ios_base(local_4c0);
        pbVar16 = (this->CustomWarningMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar16 !=
            (this->CustomWarningMatches).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_530,"Add this->CustomWarningMatches: ",0x20);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_530,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1a2,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
              operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
            std::ios_base::~ios_base(local_4c0);
            pcVar14 = (pbVar16->_M_dataplus)._M_p;
            local_478 = (char *)0x0;
            if (pcVar14 != (char *)0x0) {
              cmsys::RegularExpression::compile((RegularExpression *)local_530,pcVar14);
            }
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
            emplace_back<cmsys::RegularExpression>
                      (&this->WarningMatchRegex,(RegularExpression *)local_530);
            if (local_478 != (char *)0x0) {
              operator_delete__(local_478);
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 !=
                   (this->CustomWarningMatches).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
        poVar11 = std::ostream::_M_insert<void_const*>(local_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"Add this->WarningExceptionRegex",0x1f);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x1a4,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
        std::ios_base::~ios_base(local_4c0);
        pbVar16 = (this->CustomWarningExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar16 !=
            (this->CustomWarningExceptions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_530,"Add this->CustomWarningExceptions: ",0x23);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_530,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1a4,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
              operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
            std::ios_base::~ios_base(local_4c0);
            pcVar14 = (pbVar16->_M_dataplus)._M_p;
            local_478 = (char *)0x0;
            if (pcVar14 != (char *)0x0) {
              cmsys::RegularExpression::compile((RegularExpression *)local_530,pcVar14);
            }
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
            emplace_back<cmsys::RegularExpression>
                      (&this->WarningExceptionRegex,(RegularExpression *)local_530);
            if (local_478 != (char *)0x0) {
              operator_delete__(local_478);
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 !=
                   (this->CustomWarningExceptions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        psVar1 = &this->SimplifySourceDir;
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)(this->SimplifySourceDir)._M_string_length,0x5f43ef);
        psVar2 = &this->SimplifyBuildDir;
        std::__cxx11::string::_M_replace
                  ((ulong)psVar2,0,(char *)(this->SimplifyBuildDir)._M_string_length,0x5f43ef);
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_6a8._0_8_ = local_6a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"SourceDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_530,pcVar4,(string *)local_6a8);
        uVar6 = local_528._0_8_;
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        if ((char *)0x14 < (ulong)uVar6) {
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          pcVar14 = local_6f8 + 0x10;
          local_6f8._0_8_ = pcVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SourceDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_6a8,pcVar4,(string *)local_6f8);
          plVar12 = (long *)std::__cxx11::string::append(local_6a8);
          local_530 = (undefined1  [8])(local_528 + 8);
          pp_Var13 = (_func_int **)(plVar12 + 2);
          if ((_func_int **)*plVar12 == pp_Var13) {
            local_528._8_8_ = *pp_Var13;
            local_528._16_8_ = plVar12[3];
          }
          else {
            local_528._8_8_ = *pp_Var13;
            local_530 = (undefined1  [8])*plVar12;
          }
          local_528._0_8_ = plVar12[1];
          *plVar12 = (long)pp_Var13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          if ((char *)local_6f8._0_8_ != pcVar14) {
            operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
          }
          local_6a8._0_8_ = local_6a8 + 0x10;
          local_6a8._8_8_ = 0;
          local_6a8[0x10] = '\0';
          if ((char *)(local_528._0_8_ + -2) != (char *)0x0) {
            pcVar18 = (char *)(local_528._0_8_ + -2) + (long)local_530;
            pcVar15 = (char *)(local_528._0_8_ + -1);
            do {
              if (*pcVar18 == '/') {
                strlen(pcVar18);
                std::__cxx11::string::_M_replace((ulong)local_6a8,0,(char *)0x0,(ulong)pcVar18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6f8,"/...",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6a8);
                std::__cxx11::string::operator=((string *)local_6a8,(string *)local_6f8);
                if ((char *)local_6f8._0_8_ != pcVar14) {
                  operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
                }
                std::__cxx11::string::substr((ulong)local_6f8,(ulong)local_530);
                std::__cxx11::string::operator=((string *)local_530,(string *)local_6f8);
                if ((char *)local_6f8._0_8_ != pcVar14) {
                  operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
                }
                break;
              }
              pcVar18 = pcVar18 + -1;
              pcVar15 = pcVar15 + -1;
            } while (pcVar15 != (char *)0x1);
          }
          std::__cxx11::string::_M_assign((string *)psVar1);
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
        }
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_6a8._0_8_ = local_6a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_530,pcVar4,(string *)local_6a8);
        uVar6 = local_528._0_8_;
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
          operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
        }
        if ((char *)0x14 < (ulong)uVar6) {
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          pcVar14 = local_6f8 + 0x10;
          local_6f8._0_8_ = pcVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BuildDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_6a8,pcVar4,(string *)local_6f8);
          plVar12 = (long *)std::__cxx11::string::append(local_6a8);
          local_530 = (undefined1  [8])(local_528 + 8);
          pp_Var13 = (_func_int **)(plVar12 + 2);
          if ((_func_int **)*plVar12 == pp_Var13) {
            local_528._8_8_ = *pp_Var13;
            local_528._16_8_ = plVar12[3];
          }
          else {
            local_528._8_8_ = *pp_Var13;
            local_530 = (undefined1  [8])*plVar12;
          }
          local_528._0_8_ = plVar12[1];
          *plVar12 = (long)pp_Var13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          if ((char *)local_6f8._0_8_ != pcVar14) {
            operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
          }
          local_6a8._0_8_ = local_6a8 + 0x10;
          local_6a8._8_8_ = 0;
          local_6a8[0x10] = '\0';
          if ((char *)(local_528._0_8_ + -2) != (char *)0x0) {
            pcVar18 = (char *)(local_528._0_8_ + -2) + (long)local_530;
            pcVar15 = (char *)(local_528._0_8_ + -1);
            do {
              if (*pcVar18 == '/') {
                strlen(pcVar18);
                std::__cxx11::string::_M_replace((ulong)local_6a8,0,(char *)0x0,(ulong)pcVar18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6f8,"/...",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6a8);
                std::__cxx11::string::operator=((string *)local_6a8,(string *)local_6f8);
                if ((char *)local_6f8._0_8_ != pcVar14) {
                  operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
                }
                std::__cxx11::string::substr((ulong)local_6f8,(ulong)local_530);
                std::__cxx11::string::operator=((string *)local_530,(string *)local_6f8);
                if ((char *)local_6f8._0_8_ != pcVar14) {
                  operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
                }
                break;
              }
              pcVar18 = pcVar18 + -1;
              pcVar15 = pcVar15 + -1;
            } while (pcVar15 != (char *)0x1);
          }
          std::__cxx11::string::_M_assign((string *)psVar2);
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          if (local_530 != (undefined1  [8])(local_528 + 8)) {
            operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
          }
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_530,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)local_530);
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        dVar20 = cmsys::SystemTools::GetTime();
        this->StartBuildTime = dVar20;
        local_6fc = 0;
        bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_530);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_530,"Build with command: ",0x14);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_530,local_2d8._M_dataplus._M_p,
                               local_2d8._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1dd,(char *)local_6a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
            operator_delete((void *)local_6a8._0_8_,CONCAT71(local_6a8._17_7_,local_6a8[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_530);
          std::ios_base::~ios_base(local_4c0);
          bVar7 = false;
        }
        else {
          iVar9 = RunMakeCommand(this,local_2d8._M_dataplus._M_p,&local_6fc,
                                 local_2b8._M_dataplus._M_p,0,(ostream *)local_278);
          bVar7 = iVar9 != 4;
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_530,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)local_530);
        if (local_530 != (undefined1  [8])(local_528 + 8)) {
          operator_delete((void *)local_530,(ulong)(local_528._8_8_ + 1));
        }
        dVar20 = cmsys::SystemTools::GetTime();
        this->EndBuildTime = dVar20;
        local_2e8 = cmsys::SystemTools::GetTime();
        if (((this->SimplifySourceDir)._M_string_length != 0) &&
           (pcVar17 = (this->ErrorsAndWarnings).
                      super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           pcVar17 !=
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          do {
            cmsys::SystemTools::ReplaceString(&pcVar17->Text,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar17->PreContext,(psVar1->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar17->PostContext,(psVar1->_M_dataplus)._M_p,"/.../");
            pcVar17 = pcVar17 + 1;
          } while (pcVar17 !=
                   (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (((this->SimplifyBuildDir)._M_string_length != 0) &&
           (pcVar17 = (this->ErrorsAndWarnings).
                      super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           pcVar17 !=
           (this->ErrorsAndWarnings).
           super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          do {
            cmsys::SystemTools::ReplaceString(&pcVar17->Text,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar17->PreContext,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar17->PostContext,(psVar2->_M_dataplus)._M_p,"/.../");
            pcVar17 = pcVar17 + 1;
          } while (pcVar17 !=
                   (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_530);
        bVar8 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_530);
        if (bVar8) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_6f8,(ostream *)local_530,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_6f8);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_6f8);
          }
          else {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_6f8);
          }
          GenerateXMLFooter(this,(cmXMLWriter *)local_6f8,local_2e8 - local_2e0);
          if ((bVar7 || local_6fc != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6a8,"Error(s) when building project",0x1e);
            std::ios::widen((char)(ostream *)local_6a8 +
                            (char)*(undefined8 *)(local_6a8._0_8_ + -0x18));
            std::ostream::put((char)local_6a8);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x21c,(char *)local_6c8,false);
            if (local_6c8 != local_6b8) {
              operator_delete(local_6c8,local_6b8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
            std::ios_base::~ios_base(local_638);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"   ",3);
          poVar11 = (ostream *)std::ostream::operator<<(local_6a8,this->TotalErrors);
          pcVar14 = " or more";
          pcVar15 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar15 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,pcVar15,(ulong)(this->MaxErrors <= this->TotalErrors) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," Compiler errors",0x10);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x222,(char *)local_6c8,false);
          if (local_6c8 != local_6b8) {
            operator_delete(local_6c8,local_6b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
          std::ios_base::~ios_base(local_638);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"   ",3);
          poVar11 = (ostream *)std::ostream::operator<<(local_6a8,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar14 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,pcVar14,(ulong)(this->MaxWarnings <= this->TotalWarnings) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," Compiler warnings",0x12);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x225,(char *)local_6c8,false);
          if (local_6c8 != local_6b8) {
            operator_delete(local_6c8,local_6b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
          std::ios_base::~ios_base(local_638);
          iVar9 = local_6fc;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_6f8);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6a8,"Cannot create build XML file",0x1c);
          std::ios::widen((char)(ostream *)local_6a8 +
                          (char)*(undefined8 *)(local_6a8._0_8_ + -0x18));
          std::ostream::put((char)local_6a8);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x20a,(char *)local_6f8._0_8_,false);
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
          std::ios_base::~ios_base(local_638);
          iVar9 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_530);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar9;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
    this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < 120)
    {
    return 0;
    }

  int entry;
  for ( entry = 0;
    cmCTestWarningErrorFileLine[entry].RegularExpressionString;
    ++ entry )
    {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if ( r.RegularExpression.compile(
        cmCTestWarningErrorFileLine[entry].RegularExpressionString) )
      {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(r);
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
       << cmCTestWarningErrorFileLine[entry].RegularExpressionString
       << std::endl);
      }
    }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find MakeCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  const std::string &buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers.c_str());

  // Create a last build log
  cmGeneratedFileStream ofs;
  double elapsed_time_start = cmSystemTools::GetTime();
  if ( !this->StartLogFile("Build", ofs) )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build log file"
      << std::endl);
    }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for ( cc = 0; cmCTestErrorMatches[cc]; cc ++ )
    {
    this->CustomErrorMatches.push_back(cmCTestErrorMatches[cc]);
    }
  for ( cc = 0; cmCTestErrorExceptions[cc]; cc ++ )
    {
    this->CustomErrorExceptions.push_back(cmCTestErrorExceptions[cc]);
    }
  for ( cc = 0; cmCTestWarningMatches[cc]; cc ++ )
    {
    this->CustomWarningMatches.push_back(cmCTestWarningMatches[cc]);
    }

  for ( cc = 0; cmCTestWarningExceptions[cc]; cc ++ )
    {
    this->CustomWarningExceptions.push_back(cmCTestWarningExceptions[cc]);
    }

  // Pre-compile regular expressions objects for all regular expressions
  std::vector<std::string>::iterator it;

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes) \
  regexes.clear(); \
    cmCTestOptionalLog(this->CTest, DEBUG, this << "Add " #regexes \
    << std::endl, this->Quiet); \
  for ( it = strings.begin(); it != strings.end(); ++it ) \
    { \
    cmCTestOptionalLog(this->CTest, DEBUG, "Add " #strings ": " \
    << *it << std::endl, this->Quiet); \
    regexes.push_back(it->c_str()); \
    }
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorMatches, this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomErrorExceptions, this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningMatches, this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(
    this->CustomWarningExceptions, this->WarningExceptionRegex);


  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir = "";
  this->SimplifyBuildDir = "";
  if ( this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20 )
    {
    std::string srcdir
      = this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for ( cc = srcdir.size()-2; cc > 0; cc -- )
      {
      if ( srcdir[cc] == '/' )
        {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifySourceDir = srcdir;
    }
  if ( this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20 )
    {
    std::string bindir
      = this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for ( cc = bindir.size()-2; cc > 0; cc -- )
      {
      if ( bindir[cc] == '/' )
        {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc+1);
        break;
        }
      }
    this->SimplifyBuildDir = bindir;
    }


  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = cmSystemTools::GetTime();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if ( !this->CTest->GetShowOnly() )
    {
    res = this->RunMakeCommand(makeCommand.c_str(), &retVal,
      buildDirectory.c_str(), 0, ofs);
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG, "Build with command: " <<
      makeCommand << std::endl, this->Quiet);
    }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = cmSystemTools::GetTime();
  double elapsed_build_time = cmSystemTools::GetTime() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  t_ErrorsAndWarningsVector::iterator evit;
  if ( !this->SimplifySourceDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifySourceDir.c_str(), "/.../");
      }
    }

  if ( !this->SimplifyBuildDir.empty() )
    {
    for ( evit = this->ErrorsAndWarnings.begin();
      evit != this->ErrorsAndWarnings.end();
      ++ evit )
      {
      cmSystemTools::ReplaceString(
        evit->Text, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PreContext, this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(
        evit->PostContext, this->SimplifyBuildDir.c_str(), "/.../");
      }
    }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if(!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot create build XML file"
      << std::endl);
    return -1;
    }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if(this->UseCTestLaunch)
    {
    this->GenerateXMLLaunched(xml);
    }
  else
    {
    this->GenerateXMLLogScraped(xml);
    }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error(s) when building project"
      << std::endl);
    }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalErrors
    << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
    << " Compiler errors" << std::endl);
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "   " << this->TotalWarnings
    << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
    << " Compiler warnings" << std::endl);

  return retVal;
}